

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void bifcvs(bifcxdef *ctx,int argc)

{
  uchar uVar1;
  runsdef *prVar2;
  size_t sVar3;
  uint uVar4;
  int len;
  runcxdef *prVar5;
  char *pcVar6;
  char buf [30];
  
  pcVar6 = buf;
  prVar5 = ctx->bifcxrun;
  uVar4 = (uint)prVar5->runcxsp[-1].runstyp;
  if (7 < uVar4 - 1) {
switchD_0020ef45_caseD_2:
    prVar5->runcxerr->errcxptr->erraav[0].errastr = "cvtstr";
    ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
    runsign(ctx->bifcxrun,0x3ff);
  }
  prVar2 = prVar5->runcxsp + -1;
  switch(uVar4) {
  case 1:
    prVar5->runcxsp = prVar2;
    if (prVar2->runstyp != '\x01') {
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3eb);
    }
    sprintf(buf,"%ld",(ctx->bifcxrun->runcxsp->runsv).runsvnum);
    sVar3 = strlen(buf);
    len = (int)sVar3;
    prVar5 = ctx->bifcxrun;
    goto LAB_0020efbe;
  default:
    goto switchD_0020ef45_caseD_2;
  case 3:
    goto switchD_0020ef45_caseD_3;
  case 5:
    prVar5->runcxsp = prVar2;
    uVar1 = prVar2->runstyp;
    prVar5 = ctx->bifcxrun;
    len = 3;
    pcVar6 = "pushnil";
    break;
  case 8:
    prVar5->runcxsp = prVar2;
    uVar1 = prVar2->runstyp;
    prVar5 = ctx->bifcxrun;
    len = 4;
    pcVar6 = "pushtrue";
  }
  pcVar6 = pcVar6 + 4;
  if ((uVar1 != '\b') && (prVar5->runcxsp->runstyp != '\x05')) {
    prVar5->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3ed);
  }
LAB_0020efbe:
  runpstr(prVar5,pcVar6,len,0);
switchD_0020ef45_caseD_3:
  return;
}

Assistant:

void bifcvs(bifcxdef *ctx, int argc)
{
    char *p;
    int   len;
    char  buf[30];
    
    bifcntargs(ctx, 1, argc);
    switch(runtostyp(ctx->bifcxrun))
    {
    case DAT_NIL:
        p = "nil";
        len = 3;
        (void)runpoplog(ctx->bifcxrun);
        break;
        
    case DAT_TRUE:
        p = "true";
        len = 4;
        (void)runpoplog(ctx->bifcxrun);
        break;
        
    case DAT_NUMBER:
        sprintf(buf, "%ld", runpopnum(ctx->bifcxrun));
        p = buf;
        len = strlen(buf);
        break;

    case DAT_SSTRING:
        /* leave the string value on the stack unchanged */
        return;

    default:
        /* throw the RUNEXITOBJ error */
        runsig1(ctx->bifcxrun, ERR_INVTBIF, ERRTSTR, "cvtstr");
    }
    
    runpstr(ctx->bifcxrun, p, len, 0);
}